

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  undefined8 uVar1;
  byte bVar2;
  Verbosity VVar3;
  Tolerances *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ostream *poVar6;
  ostream **ppoVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  undefined7 in_register_00000009;
  long lVar13;
  Verbosity old_verbosity;
  Verbosity VVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  Verbosity old_verbosity_1;
  int iVar24;
  byte bVar25;
  Real RVar26;
  double dVar27;
  Verbosity old_verbosity_3;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  fpclass_type local_3f8;
  int32_t iStack_3f4;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  ulong local_3c0;
  long local_3b8;
  long local_3b0;
  data_type local_3a8;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [13];
  undefined3 uStack_33b;
  undefined5 uStack_338;
  undefined8 local_330;
  long local_320;
  data_type local_318;
  char local_303;
  char local_302;
  uint local_2f8;
  void *local_2f0;
  char local_2e3;
  char local_2e2;
  data_type local_2d8;
  char local_2c3;
  char local_2c2;
  uint local_2b8;
  void *local_2b0;
  char local_2a3;
  char local_2a2;
  cpp_dec_float<200U,_int,_void> local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar25 = 0;
  local_3b0 = CONCAT44(local_3b0._4_4_,(int)CONCAT71(in_register_00000009,real));
  pTVar4 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  RVar26 = ::soplex::Tolerances::epsilon(pTVar4);
  dVar27 = log10(RVar26);
  uVar20 = (uint)-dVar27;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  iVar24 = uVar20 + 10;
  if ((char)rownames != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&local_3d8,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar9 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRay(soplex,&local_3d8);
    if (bVar9) {
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
        (soplex->spxout).m_verbosity = VVar14;
      }
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_3b8 = (long)(int)uVar20;
        lVar22 = 0xf;
        lVar21 = 0;
        local_3c0 = (ulong)uVar20;
        do {
          puVar15 = ((local_3d8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar22 * 2;
          puVar16 = puVar15 + -0x1e;
          puVar17 = local_a0;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar17 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar25 * -2 + 1;
          }
          iVar10 = puVar15[-2];
          bVar2 = *(byte *)(puVar15 + -1);
          uVar1 = *(undefined8 *)puVar15;
          pTVar4 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          RVar26 = ::soplex::Tolerances::epsilon(pTVar4);
          puVar15 = local_a0;
          pcVar18 = &local_290;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar18->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar25 * -2 + 1;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar18 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_3f8 = (fpclass_type)uVar1;
          iStack_3f4 = (int32_t)((ulong)uVar1 >> 0x20);
          local_290.fpclass = local_3f8;
          local_290.prec_elem = iStack_3f4;
          local_290.neg = (bool)bVar2;
          if ((bVar2 != 0) && (local_290.data._M_elems[0] != 0 || local_3f8 != cpp_dec_float_finite)
             ) {
            local_290.neg = (bool)(bVar2 ^ 1);
          }
          bVar9 = false;
          local_290.exp = iVar10;
          if ((local_3f8 != cpp_dec_float_NaN) && (!NAN(RVar26))) {
            local_330 = 0x1c00000000;
            local_3a8.double_first = 0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = SUB1613((undefined1  [16])0x0,0);
            uStack_33b = 0;
            uStack_338 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_3a8.ld,RVar26);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_290,(cpp_dec_float<200U,_int,_void> *)&local_3a8.ld);
            bVar9 = 0 < iVar10;
          }
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          if ((bVar9) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar6 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar6 + -0x18) + (int)poVar6);
            }
            else {
              pcVar23 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar21].idx].data;
              sVar12 = strlen(pcVar23);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar23,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar3 = (soplex->spxout).m_verbosity;
            ppoVar7 = (soplex->spxout).m_streams;
            poVar6 = ppoVar7[VVar3];
            lVar13 = *(long *)poVar6;
            *(long *)(poVar6 + *(long *)(lVar13 + -0x18) + 0x10) = (long)iVar24;
            *(long *)(poVar6 + *(long *)(lVar13 + -0x18) + 8) = local_3b8;
            puVar15 = ((local_3d8.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                      lVar22 * 2 + -0x1e;
            puVar16 = puVar15;
            pnVar19 = &local_190;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar19->m_backend).data._M_elems[0] = *puVar16;
              puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
            }
            local_190.m_backend.exp = puVar15[0x1c];
            local_190.m_backend.neg = SUB41(puVar15[0x1d],0);
            local_190.m_backend.fpclass = puVar15[0x1e];
            local_190.m_backend.prec_elem = puVar15[0x1f];
            boost::multiprecision::operator<<(ppoVar7[VVar3],&local_190);
            poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar8 = (char)poVar6;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
            std::ostream::put(cVar8);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar14;
          }
          lVar21 = lVar21 + 1;
          lVar22 = lVar22 + 0x10;
        } while (lVar21 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar14 = (soplex->spxout).m_verbosity;
        uVar20 = (uint)local_3c0;
      }
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar21 + -0x18) + 8) = 1;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar6 + lVar21 + 0x18) = *(uint *)(poVar6 + lVar21 + 0x18) & 0xfffffefb | 0x100;
        pTVar4 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        RVar26 = ::soplex::Tolerances::epsilon(pTVar4);
        std::ostream::_M_insert<double>(RVar26);
        poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar21 + -0x18) + 8) = 8;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar6 + lVar21 + 0x18) = *(uint *)(poVar6 + lVar21 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,").",2);
        poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar8 = (char)poVar6;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        (soplex->spxout).m_verbosity = VVar14;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x110 & 1) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0))))
            && (bVar9 = ::soplex::
                        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::getPrimal(soplex,&local_3d8), bVar9)) {
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
        (soplex->spxout).m_verbosity = VVar14;
      }
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        iVar10 = 0;
      }
      else {
        local_3b8 = (long)iVar24;
        local_320 = (long)(int)uVar20;
        lVar22 = 0;
        lVar21 = 0xf;
        iVar10 = 0;
        local_3c0 = (ulong)uVar20;
        do {
          puVar15 = ((local_3d8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar21 * 2;
          puVar16 = puVar15 + -0x1e;
          puVar17 = local_110;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar17 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar25 * -2 + 1;
          }
          iVar11 = puVar15[-2];
          bVar2 = *(byte *)(puVar15 + -1);
          uVar1 = *(undefined8 *)puVar15;
          pTVar4 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          RVar26 = ::soplex::Tolerances::epsilon(pTVar4);
          puVar15 = local_110;
          pcVar18 = &local_290;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar18->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar25 * -2 + 1;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar18 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_3f8 = (fpclass_type)uVar1;
          iStack_3f4 = (int32_t)((ulong)uVar1 >> 0x20);
          local_290.fpclass = local_3f8;
          local_290.prec_elem = iStack_3f4;
          local_290.neg = (bool)bVar2;
          if ((bVar2 != 0) && (local_290.data._M_elems[0] != 0 || local_3f8 != cpp_dec_float_finite)
             ) {
            local_290.neg = (bool)(bVar2 ^ 1);
          }
          bVar9 = false;
          local_290.exp = iVar11;
          if ((local_3f8 != cpp_dec_float_NaN) && (!NAN(RVar26))) {
            local_330 = 0x1c00000000;
            local_3a8.double_first = 0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = SUB1613((undefined1  [16])0x0,0);
            uStack_33b = 0;
            uStack_338 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_3a8.ld,RVar26);
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_290,(cpp_dec_float<200U,_int,_void> *)&local_3a8.ld);
            bVar9 = 0 < iVar11;
          }
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          if (bVar9) {
            VVar14 = (soplex->spxout).m_verbosity;
            if (2 < (int)VVar14) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar6 = (soplex->spxout).m_streams[3];
              if (colnames->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar6 + -0x18) + (int)poVar6);
              }
              else {
                pcVar23 = colnames->mem +
                          (colnames->set).theitem[(colnames->set).thekey[lVar22].idx].data;
                sVar12 = strlen(pcVar23);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar23,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar3 = (soplex->spxout).m_verbosity;
              ppoVar7 = (soplex->spxout).m_streams;
              poVar6 = ppoVar7[VVar3];
              lVar13 = *(long *)poVar6;
              *(long *)(poVar6 + *(long *)(lVar13 + -0x18) + 0x10) = local_3b8;
              *(long *)(poVar6 + *(long *)(lVar13 + -0x18) + 8) = local_320;
              puVar15 = ((local_3d8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                        lVar21 * 2 + -0x1e;
              puVar16 = puVar15;
              pnVar19 = &local_210;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pnVar19->m_backend).data._M_elems[0] = *puVar16;
                puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
                pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_210.m_backend.exp = puVar15[0x1c];
              local_210.m_backend.neg = SUB41(puVar15[0x1d],0);
              local_210.m_backend.fpclass = puVar15[0x1e];
              local_210.m_backend.prec_elem = puVar15[0x1f];
              boost::multiprecision::operator<<(ppoVar7[VVar3],&local_210);
              poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar8 = (char)poVar6;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
              std::ostream::put(cVar8);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar14;
            }
            iVar10 = iVar10 + 1;
          }
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x10;
        } while (lVar22 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar14 = (soplex->spxout).m_verbosity;
        uVar20 = (uint)local_3c0;
      }
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other variables are zero (within ",0x25);
        poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar21 + -0x18) + 8) = 1;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar6 + lVar21 + 0x18) = *(uint *)(poVar6 + lVar21 + 0x18) & 0xfffffefb | 0x100;
        pTVar4 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        RVar26 = ::soplex::Tolerances::epsilon(pTVar4);
        std::ostream::_M_insert<double>(RVar26);
        poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar21 + -0x18) + 8) = 8;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar6 + lVar21 + 0x18) = *(uint *)(poVar6 + lVar21 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"). Solution has ",0x10);
        std::ostream::operator<<
                  ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11
                  );
        poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar8 = (char)poVar6;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        (soplex->spxout).m_verbosity = VVar14;
      }
    }
    else {
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal information available.\n",0x21);
        (soplex->spxout).m_verbosity = VVar14;
      }
    }
    if (local_3d8.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d8.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_3b0 == '\0') {
    return;
  }
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_290,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar9 = ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getPrimalRayRational
                    (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                             *)&local_290);
  if (bVar9) {
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
      (soplex->spxout).m_verbosity = VVar14;
    }
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_3b0 = (long)iVar24;
      lVar21 = 0;
      lVar22 = 0;
      do {
        lVar13 = CONCAT44(local_290.data._M_elems[1],local_290.data._M_elems[0]);
        local_3d8.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_3a8.ld,(longlong *)&local_3d8,(type *)0x0);
        iVar24 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)(lVar13 + lVar21),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_3a8.ld);
        if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
          operator_delete((void *)local_388._8_8_,(ulong)(uint)local_388._0_4_ << 3);
        }
        if ((local_398[5] == '\0') && (local_398[6] == '\0')) {
          operator_delete(local_3a8.ld.data,(ulong)local_3a8.ld.capacity << 3);
        }
        if ((iVar24 != 0) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar6 = (soplex->spxout).m_streams[3];
          if (colnames->mem == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar6 + -0x18) + (int)poVar6);
          }
          else {
            pcVar23 = colnames->mem +
                      (colnames->set).theitem[(colnames->set).thekey[lVar22].idx].data;
            sVar12 = strlen(pcVar23);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar23,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar13 = *(long *)poVar6;
          *(long *)(poVar6 + *(long *)(lVar13 + -0x18) + 0x10) = local_3b0;
          *(long *)(poVar6 + *(long *)(lVar13 + -0x18) + 8) = (long)(int)uVar20;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2d8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)(CONCAT44(local_290.data._M_elems[1],local_290.data._M_elems[0]) +
                                lVar21));
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_2d8.ld);
          poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar8 = (char)poVar6;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
          std::ostream::put(cVar8);
          std::ostream::flush();
          if ((local_2a3 == '\0') && (local_2a2 == '\0')) {
            operator_delete(local_2b0,(ulong)local_2b8 << 3);
          }
          if ((local_2c3 == '\0') && (local_2c2 == '\0')) {
            operator_delete(local_2d8.ld.data,(ulong)local_2d8.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar14;
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x40;
      } while (lVar22 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
      VVar14 = (soplex->spxout).m_verbosity;
    }
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
      poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar8 = (char)poVar6;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      (soplex->spxout).m_verbosity = VVar14;
    }
  }
  if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x110 & 1) != 0)) ||
      ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
     (bVar9 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                          *)&local_290), bVar9)) {
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
      (soplex->spxout).m_verbosity = VVar14;
    }
    if ((soplex->_rationalLP->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum < 1) {
      iVar24 = 0;
    }
    else {
      lVar21 = 0;
      lVar22 = 0;
      iVar24 = 0;
      do {
        lVar13 = CONCAT44(local_290.data._M_elems[1],local_290.data._M_elems[0]);
        local_3d8.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_3a8.ld,(longlong *)&local_3d8,(type *)0x0);
        iVar10 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)(lVar13 + lVar21),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_3a8.ld);
        if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
          operator_delete((void *)local_388._8_8_,(ulong)(uint)local_388._0_4_ << 3);
        }
        if ((local_398[5] == '\0') && (local_398[6] == '\0')) {
          operator_delete(local_3a8.ld.data,(ulong)local_3a8.ld.capacity << 3);
        }
        if (iVar10 != 0) {
          VVar14 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar14) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar6 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar6 + -0x18) + (int)poVar6);
            }
            else {
              pcVar23 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar22].idx].data;
              sVar12 = strlen(pcVar23);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar23,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_318.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)(CONCAT44(local_290.data._M_elems[1],local_290.data._M_elems[0]) +
                                  lVar21));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_318.ld);
            poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar8 = (char)poVar6;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
            std::ostream::put(cVar8);
            std::ostream::flush();
            if ((local_2e3 == '\0') && (local_2e2 == '\0')) {
              operator_delete(local_2f0,(ulong)local_2f8 << 3);
            }
            if ((local_303 == '\0') && (local_302 == '\0')) {
              operator_delete(local_318.ld.data,(ulong)local_318.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar14;
          }
          iVar24 = iVar24 + 1;
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x40;
      } while (lVar22 < (soplex->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .set.thenum);
      VVar14 = (soplex->spxout).m_verbosity;
    }
    if ((int)VVar14 < 3) goto LAB_00143682;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"All other variables are zero. Solution has ",0x2b);
    std::ostream::operator<<
              ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11);
    poVar6 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
    cVar8 = (char)poVar6;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
  }
  else {
    VVar14 = (soplex->spxout).m_verbosity;
    if ((int)VVar14 < 3) goto LAB_00143682;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"No primal (rational) solution available.\n",0x29);
  }
  (soplex->spxout).m_verbosity = VVar14;
LAB_00143682:
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             *)&local_290);
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}